

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  undefined2 uVar1;
  int a_00;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  stbi_uc *psVar6;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  stbi__uint32 sVar11;
  ulong uVar12;
  stbi_uc *psVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  byte bVar22;
  int iVar23;
  long lVar24;
  byte bVar25;
  long lVar26;
  uint uVar27;
  byte *pbVar28;
  int iVar29;
  uint uVar30;
  stbi_uc *psVar31;
  byte *pbVar32;
  long lVar33;
  long lVar34;
  long in_FS_OFFSET;
  bool bVar35;
  ulong local_a0;
  ulong uVar7;
  
  a_00 = a->s->img_n;
  bVar35 = depth == 0x10;
  psVar6 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar35,0);
  a->out = psVar6;
  if (psVar6 == (stbi_uc *)0x0) {
    pcVar8 = "outofmem";
  }
  else {
    iVar3 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar3 == 0) {
      pcVar8 = "too large";
    }
    else {
      uVar19 = a_00 * x;
      uVar4 = uVar19 * depth + 7 >> 3;
      uVar7 = (ulong)uVar4;
      if (raw_len < (uVar4 + 1) * y) {
        pcVar8 = "not enough pixels";
      }
      else {
        uVar21 = x * out_n;
        if (y == 0) {
joined_r0x00112952:
          if (depth != 0x10) {
            return 1;
          }
LAB_00112954:
          if (uVar21 * y == 0) {
            return 1;
          }
          lVar10 = 0;
          psVar6 = a->out;
          do {
            uVar1 = swap_bytes(*(undefined2 *)(psVar6 + lVar10 * 2));
            *(undefined2 *)(psVar6 + lVar10 * 2) = uVar1;
            lVar10 = lVar10 + 1;
          } while (uVar21 * y != (int)lVar10);
          return 1;
        }
        bVar22 = *raw;
        uVar15 = 0;
        if (depth < 8) {
          uVar15 = (ulong)(uVar21 - uVar4);
        }
        if (bVar22 < 5) {
          lVar34 = (long)(out_n << bVar35);
          uVar20 = uVar21 << bVar35;
          uVar9 = (ulong)y;
          uVar14 = 0;
          uVar12 = (ulong)uVar20;
          lVar24 = 0;
          lVar10 = -lVar34;
          local_a0 = (ulong)x;
          iVar3 = x - 1;
          psVar6 = a->out;
          uVar4 = a_00 << bVar35;
          do {
            uVar27 = uVar4;
            if (depth < 8) {
              local_a0 = uVar7;
              uVar27 = 1;
            }
            if (lVar24 == 0) {
              bVar22 = ""[bVar22];
            }
            lVar33 = uVar15 - uVar12;
            if (0 < (int)uVar27) {
              uVar18 = 0;
              do {
                switch(bVar22) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar2 = raw[uVar18 + 1];
                  goto LAB_0011234e;
                case 2:
                case 4:
                  bVar2 = psVar6[uVar18 + lVar33];
                  break;
                case 3:
                  bVar2 = psVar6[uVar18 + lVar33] >> 1;
                  break;
                default:
                  goto switchD_00112338_default;
                }
                bVar2 = bVar2 + raw[uVar18 + 1];
LAB_0011234e:
                psVar6[uVar18 + uVar15] = bVar2;
switchD_00112338_default:
                uVar18 = uVar18 + 1;
              } while (uVar27 != uVar18);
            }
            if (depth == 8) {
              if (a_00 != out_n) {
                psVar6[a_00] = 0xff;
              }
              raw = raw + (long)a_00 + 1;
              psVar31 = psVar6 + out_n;
              lVar26 = (long)out_n;
            }
            else if (depth == 0x10) {
              if (a_00 != out_n) {
                (psVar6 + (int)uVar4)[0] = 0xff;
                (psVar6 + (int)uVar4)[1] = 0xff;
              }
              raw = raw + (long)(int)uVar4 + 1;
              psVar31 = psVar6 + lVar34;
              lVar26 = lVar34;
            }
            else {
              raw = raw + 2;
              psVar31 = psVar6 + uVar15 + 1;
              lVar26 = 1;
            }
            psVar13 = psVar6 + lVar26 + lVar33;
            if (depth < 8 || a_00 == out_n) {
              uVar4 = ((int)local_a0 + -1) * uVar27;
              switch(bVar22) {
              case 0:
                memcpy(psVar31,raw,(long)(int)uVar4);
                break;
              case 1:
                if (0 < (int)uVar4) {
                  uVar14 = 0;
                  do {
                    psVar31[uVar14] = psVar31[uVar14 - (long)(int)uVar27] + raw[uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar4 != uVar14);
                }
                break;
              case 2:
                if (0 < (int)uVar4) {
                  uVar14 = 0;
                  do {
                    psVar31[uVar14] = psVar13[uVar14] + raw[uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar4 != uVar14);
                }
                break;
              case 3:
                if (0 < (int)uVar4) {
                  uVar14 = 0;
                  do {
                    psVar31[uVar14] =
                         (char)((uint)psVar31[uVar14 - (long)(int)uVar27] + (uint)psVar13[uVar14] >>
                               1) + raw[uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar4 != uVar14);
                }
                break;
              case 4:
                if (0 < (int)uVar4) {
                  uVar14 = 0;
                  do {
                    bVar22 = psVar31[uVar14 - (long)(int)uVar27];
                    bVar2 = psVar13[uVar14];
                    bVar25 = psVar6[uVar14 + (lVar26 - (int)uVar27) + (uVar15 - uVar12)];
                    iVar29 = ((uint)bVar2 + (uint)bVar22) - (uint)bVar25;
                    uVar16 = iVar29 - (uint)bVar22;
                    uVar5 = -uVar16;
                    if (0 < (int)uVar16) {
                      uVar5 = uVar16;
                    }
                    uVar17 = iVar29 - (uint)bVar2;
                    uVar16 = -uVar17;
                    if (0 < (int)uVar17) {
                      uVar16 = uVar17;
                    }
                    uVar30 = iVar29 - (uint)bVar25;
                    uVar17 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar17 = uVar30;
                    }
                    if (uVar16 <= uVar17) {
                      bVar25 = bVar2;
                    }
                    if (uVar17 < uVar5) {
                      bVar22 = bVar25;
                    }
                    if (uVar16 < uVar5) {
                      bVar22 = bVar25;
                    }
                    psVar31[uVar14] = bVar22 + raw[uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar4 != uVar14);
                }
                break;
              case 5:
                if (0 < (int)uVar4) {
                  uVar14 = 0;
                  do {
                    psVar31[uVar14] = (psVar31[uVar14 - (long)(int)uVar27] >> 1) + raw[uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar4 != uVar14);
                }
                break;
              case 6:
                if (0 < (int)uVar4) {
                  uVar14 = 0;
                  do {
                    psVar31[uVar14] = psVar31[uVar14 - (long)(int)uVar27] + raw[uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar4 != uVar14);
                }
              }
              raw = raw + (int)uVar4;
LAB_001128d8:
              if (lVar24 + 1U == uVar9) {
                if (depth < 8) {
                  if (y == 0) {
                    return 1;
                  }
                  uVar4 = x - 1;
                  uVar27 = 0;
                  uVar15 = 0;
                  lVar24 = (ulong)uVar4 + 1;
                  lVar10 = uVar21 - uVar7;
                  do {
                    bVar22 = 1;
                    if (color == 0) {
                      bVar22 = ""[depth];
                    }
                    uVar12 = (ulong)uVar27;
                    psVar6 = a->out;
                    pbVar28 = psVar6 + uVar20 * (int)uVar15;
                    pbVar32 = pbVar28 + (uVar21 - uVar7);
                    if (depth == 4) {
                      uVar5 = uVar19;
                      if (1 < (int)uVar19) {
                        psVar31 = psVar6 + lVar10;
                        uVar16 = uVar19;
                        do {
                          psVar6[uVar12] = (psVar31[uVar12] >> 4) * bVar22;
                          pbVar32 = psVar31 + uVar12;
                          psVar31 = psVar31 + 1;
                          psVar6[uVar12 + 1] = (*pbVar32 & 0xf) * bVar22;
                          uVar5 = uVar16 - 2;
                          psVar6 = psVar6 + 2;
                          bVar35 = 3 < uVar16;
                          uVar16 = uVar5;
                        } while (bVar35);
                        pbVar28 = psVar6 + uVar12;
                        pbVar32 = psVar31 + uVar12;
                      }
                      if (uVar5 == 1) {
                        *pbVar28 = (*pbVar32 >> 4) * bVar22;
                      }
                    }
                    else if (depth == 2) {
                      uVar5 = uVar19;
                      if (3 < (int)uVar19) {
                        psVar31 = psVar6 + lVar10;
                        uVar16 = uVar19;
                        do {
                          uVar5 = uVar16 - 4;
                          psVar6[uVar12] = (psVar31[uVar12] >> 6) * bVar22;
                          psVar6[uVar12 + 1] = (psVar31[uVar12] >> 4 & 3) * bVar22;
                          psVar6[uVar12 + 2] = (psVar31[uVar12] >> 2 & 3) * bVar22;
                          pbVar32 = psVar31 + uVar12;
                          psVar31 = psVar31 + 1;
                          psVar6[uVar12 + 3] = (*pbVar32 & 3) * bVar22;
                          psVar6 = psVar6 + 4;
                          bVar35 = 7 < uVar16;
                          uVar16 = uVar5;
                        } while (bVar35);
                        pbVar28 = psVar6 + uVar12;
                        pbVar32 = psVar31 + uVar12;
                      }
                      if (((0 < (int)uVar5) && (*pbVar28 = (*pbVar32 >> 6) * bVar22, uVar5 != 1)) &&
                         (pbVar28[1] = (*pbVar32 >> 4 & 3) * bVar22, uVar5 == 3)) {
                        pbVar28[2] = (*pbVar32 >> 2 & 3) * bVar22;
                      }
                    }
                    else if (depth == 1) {
                      uVar5 = uVar19;
                      if (7 < (int)uVar19) {
                        psVar31 = psVar6 + lVar10;
                        uVar16 = uVar19;
                        do {
                          psVar6[uVar12] = (char)psVar31[uVar12] >> 7 & bVar22;
                          psVar6[uVar12 + 1] = (char)(psVar31[uVar12] * '\x02') >> 7 & bVar22;
                          psVar6[uVar12 + 2] = (char)(psVar31[uVar12] << 2) >> 7 & bVar22;
                          psVar6[uVar12 + 3] = (char)(psVar31[uVar12] << 3) >> 7 & bVar22;
                          psVar6[uVar12 + 4] = (char)(psVar31[uVar12] << 4) >> 7 & bVar22;
                          psVar6[uVar12 + 5] = (char)(psVar31[uVar12] << 5) >> 7 & bVar22;
                          psVar6[uVar12 + 6] = (char)(psVar31[uVar12] << 6) >> 7 & bVar22;
                          bVar2 = bVar22;
                          if ((psVar31[uVar12] & 1) == 0) {
                            bVar2 = 0;
                          }
                          psVar31 = psVar31 + 1;
                          psVar6[uVar12 + 7] = bVar2;
                          uVar5 = uVar16 - 8;
                          psVar6 = psVar6 + 8;
                          bVar35 = 0xf < uVar16;
                          uVar16 = uVar5;
                        } while (bVar35);
                        pbVar28 = psVar6 + uVar12;
                        pbVar32 = psVar31 + uVar12;
                      }
                      if (((((0 < (int)uVar5) &&
                            (*pbVar28 = (char)*pbVar32 >> 7 & bVar22, uVar5 != 1)) &&
                           ((pbVar28[1] = (char)(*pbVar32 * '\x02') >> 7 & bVar22, 2 < uVar5 &&
                            ((pbVar28[2] = (char)(*pbVar32 << 2) >> 7 & bVar22, uVar5 != 3 &&
                             (pbVar28[3] = (char)(*pbVar32 << 3) >> 7 & bVar22, 4 < uVar5)))))) &&
                          (pbVar28[4] = (char)(*pbVar32 << 4) >> 7 & bVar22, uVar5 != 5)) &&
                         (pbVar28[5] = (char)(*pbVar32 << 5) >> 7 & bVar22, uVar5 == 7)) {
                        pbVar28[6] = (char)(*pbVar32 << 6) >> 7 & bVar22;
                      }
                    }
                    if (a_00 != out_n) {
                      psVar6 = a->out;
                      if (a_00 == 1) {
                        lVar34 = lVar24;
                        if (-1 < (int)uVar4) {
                          do {
                            psVar6[lVar34 * 2 + (uVar12 - 1)] = 0xff;
                            psVar6[lVar34 * 2 + (uVar12 - 2)] = psVar6[lVar34 + (uVar12 - 1)];
                            lVar33 = lVar34 + -1;
                            bVar35 = 0 < lVar34;
                            lVar34 = lVar33;
                          } while (lVar33 != 0 && bVar35);
                        }
                      }
                      else if (-1 < (int)uVar4) {
                        psVar31 = psVar6 + (ulong)uVar4 * 3 + 2 + uVar12;
                        lVar34 = lVar24;
                        do {
                          psVar6[lVar34 * 4 + (uVar12 - 1)] = 0xff;
                          psVar6[lVar34 * 4 + (uVar12 - 2)] = *psVar31;
                          psVar6[lVar34 * 4 + (uVar12 - 3)] = psVar31[-1];
                          psVar13 = psVar31 + -2;
                          psVar31 = psVar31 + -3;
                          psVar6[lVar34 * 4 + (uVar12 - 4)] = *psVar13;
                          lVar33 = lVar34 + -1;
                          bVar35 = 0 < lVar34;
                          lVar34 = lVar33;
                        } while (lVar33 != 0 && bVar35);
                      }
                    }
                    uVar27 = uVar27 + uVar20;
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != uVar9);
                  return 1;
                }
                goto joined_r0x00112952;
              }
            }
            else {
              switch(bVar22) {
              case 0:
                if (iVar3 != 0) {
                  iVar29 = iVar3;
                  do {
                    if (0 < (int)uVar27) {
                      uVar18 = 0;
                      do {
                        psVar31[uVar18] = raw[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar27 != uVar18);
                    }
                    psVar31[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar31 = psVar31 + lVar34;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 1:
                if (iVar3 != 0) {
                  lVar33 = (long)psVar31 + lVar10;
                  iVar29 = iVar3;
                  do {
                    if (0 < (int)uVar27) {
                      uVar18 = 0;
                      do {
                        psVar31[uVar18] = *(char *)(lVar33 + uVar18) + raw[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar27 != uVar18);
                    }
                    psVar31[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar31 = psVar31 + lVar34;
                    lVar33 = lVar33 + lVar34;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 2:
                if (iVar3 != 0) {
                  iVar29 = iVar3;
                  do {
                    if (0 < (int)uVar27) {
                      uVar18 = 0;
                      do {
                        psVar31[uVar18] = psVar13[uVar18] + raw[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar27 != uVar18);
                    }
                    psVar31[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar31 = psVar31 + lVar34;
                    psVar13 = psVar13 + lVar34;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 3:
                if (iVar3 != 0) {
                  lVar33 = (long)psVar31 + lVar10;
                  iVar29 = iVar3;
                  do {
                    if (0 < (int)uVar27) {
                      uVar18 = 0;
                      do {
                        psVar31[uVar18] =
                             (char)((uint)*(byte *)(lVar33 + uVar18) + (uint)psVar13[uVar18] >> 1) +
                             raw[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar27 != uVar18);
                    }
                    psVar31[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar31 = psVar31 + lVar34;
                    psVar13 = psVar13 + lVar34;
                    lVar33 = lVar33 + lVar34;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 4:
                if (iVar3 != 0) {
                  psVar6 = psVar6 + lVar26 + ((uVar15 - lVar34) - uVar12);
                  lVar33 = (long)psVar31 + lVar10;
                  iVar29 = iVar3;
                  do {
                    if (0 < (int)uVar27) {
                      uVar18 = 0;
                      do {
                        bVar22 = *(byte *)(lVar33 + uVar18);
                        bVar2 = psVar13[uVar18];
                        bVar25 = psVar6[uVar18];
                        iVar23 = ((uint)bVar2 + (uint)bVar22) - (uint)bVar25;
                        uVar16 = iVar23 - (uint)bVar22;
                        uVar5 = -uVar16;
                        if (0 < (int)uVar16) {
                          uVar5 = uVar16;
                        }
                        uVar17 = iVar23 - (uint)bVar2;
                        uVar16 = -uVar17;
                        if (0 < (int)uVar17) {
                          uVar16 = uVar17;
                        }
                        uVar30 = iVar23 - (uint)bVar25;
                        uVar17 = -uVar30;
                        if (0 < (int)uVar30) {
                          uVar17 = uVar30;
                        }
                        if (uVar16 <= uVar17) {
                          bVar25 = bVar2;
                        }
                        if (uVar17 < uVar5) {
                          bVar22 = bVar25;
                        }
                        if (uVar16 < uVar5) {
                          bVar22 = bVar25;
                        }
                        psVar31[uVar18] = bVar22 + raw[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar27 != uVar18);
                    }
                    psVar31[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar31 = psVar31 + lVar34;
                    psVar13 = psVar13 + lVar34;
                    lVar33 = lVar33 + lVar34;
                    psVar6 = psVar6 + lVar34;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 5:
                if (iVar3 != 0) {
                  lVar33 = (long)psVar31 + lVar10;
                  iVar29 = iVar3;
                  do {
                    if (0 < (int)uVar27) {
                      uVar18 = 0;
                      do {
                        psVar31[uVar18] = (*(byte *)(lVar33 + uVar18) >> 1) + raw[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar27 != uVar18);
                    }
                    psVar31[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar31 = psVar31 + lVar34;
                    lVar33 = lVar33 + lVar34;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 6:
                if (iVar3 != 0) {
                  lVar33 = (long)psVar31 + lVar10;
                  iVar29 = iVar3;
                  do {
                    if (0 < (int)uVar27) {
                      uVar18 = 0;
                      do {
                        psVar31[uVar18] = *(char *)(lVar33 + uVar18) + raw[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar27 != uVar18);
                    }
                    psVar31[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar31 = psVar31 + lVar34;
                    lVar33 = lVar33 + lVar34;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
              }
              if (depth != 0x10) goto LAB_001128d8;
              if (x != 0) {
                psVar6 = a->out + (long)(int)uVar4 + uVar14 + 1;
                sVar11 = x;
                do {
                  *psVar6 = 0xff;
                  psVar6 = psVar6 + lVar34;
                  sVar11 = sVar11 - 1;
                } while (sVar11 != 0);
                goto LAB_001128d8;
              }
              if (lVar24 + 1U == uVar9) goto LAB_00112954;
            }
            lVar24 = lVar24 + 1;
            bVar22 = *raw;
            uVar14 = (ulong)(uVar20 * (int)lVar24);
            psVar6 = a->out + uVar14;
            uVar4 = uVar27;
          } while (bVar22 < 5);
        }
        pcVar8 = "invalid filter";
      }
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar8;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }